

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstrlib.c
# Opt level: O0

char * match(MatchState *ms,char *s,char *p)

{
  int iVar1;
  char *pcVar2;
  char *ep_00;
  uint local_58;
  char *local_50;
  char *res;
  char *ep_1;
  char previous;
  char *ep;
  char *p_local;
  char *s_local;
  MatchState *ms_local;
  
  iVar1 = ms->matchdepth;
  ms->matchdepth = iVar1 + -1;
  ep = p;
  p_local = s;
  if (iVar1 == 0) {
    luaL_error(ms->L,"pattern too complex");
  }
LAB_00121a30:
  pcVar2 = p_local;
  if (ep == ms->p_end) goto LAB_00121db0;
  switch(*ep) {
  case '$':
    if (ep + 1 == ms->p_end) {
      if (p_local == ms->src_end) {
        local_50 = p_local;
      }
      else {
        local_50 = (char *)0x0;
      }
      p_local = local_50;
      pcVar2 = p_local;
      goto LAB_00121db0;
    }
    break;
  case '%':
    iVar1 = (int)ep[1];
    if (iVar1 - 0x30U < 10) {
      p_local = match_capture(ms,p_local,(uint)(byte)ep[1]);
      pcVar2 = p_local;
      if (p_local == (char *)0x0) goto LAB_00121db0;
      ep = ep + 2;
    }
    else if (iVar1 == 0x62) {
      p_local = matchbalance(ms,p_local,ep + 2);
      pcVar2 = p_local;
      if (p_local == (char *)0x0) goto LAB_00121db0;
      ep = ep + 4;
    }
    else {
      if (iVar1 != 0x66) break;
      pcVar2 = ep + 2;
      if (*pcVar2 != '[') {
        luaL_error(ms->L,"missing \'[\' after \'%%f\' in pattern");
      }
      ep = classend(ms,pcVar2);
      if (p_local == ms->src_init) {
        local_58 = 0;
      }
      else {
        local_58 = (uint)p_local[-1];
      }
      iVar1 = matchbracketclass(local_58 & 0xff,pcVar2,ep + -1);
      if ((iVar1 != 0) ||
         (iVar1 = matchbracketclass((uint)(byte)*p_local,pcVar2,ep + -1), iVar1 == 0)) {
        p_local = (char *)0x0;
        pcVar2 = p_local;
LAB_00121db0:
        p_local = pcVar2;
        ms->matchdepth = ms->matchdepth + 1;
        return p_local;
      }
    }
    goto LAB_00121a30;
  default:
    break;
  case '(':
    if (ep[1] == ')') {
      pcVar2 = start_capture(ms,p_local,ep + 2,-2);
    }
    else {
      pcVar2 = start_capture(ms,p_local,ep + 1,-1);
    }
    goto LAB_00121db0;
  case ')':
    pcVar2 = end_capture(ms,p_local,ep + 1);
    goto LAB_00121db0;
  }
  ep_00 = classend(ms,ep);
  iVar1 = singlematch(ms,p_local,ep,ep_00);
  if (iVar1 == 0) {
    if (((*ep_00 != '*') && (*ep_00 != '?')) && (*ep_00 != '-')) {
      p_local = (char *)0x0;
      pcVar2 = p_local;
      goto LAB_00121db0;
    }
    ep = ep_00 + 1;
  }
  else {
    switch(*ep_00) {
    case '+':
      p_local = p_local + 1;
    case '*':
      pcVar2 = max_expand(ms,p_local,ep,ep_00);
      goto LAB_00121db0;
    default:
      p_local = p_local + 1;
      ep = ep_00;
      break;
    case '-':
      pcVar2 = min_expand(ms,p_local,ep,ep_00);
      goto LAB_00121db0;
    case '?':
      pcVar2 = match(ms,p_local + 1,ep_00 + 1);
      if (pcVar2 != (char *)0x0) goto LAB_00121db0;
      ep = ep_00 + 1;
    }
  }
  goto LAB_00121a30;
}

Assistant:

static const char *match(MatchState *ms, const char *s, const char *p) {
    if (ms->matchdepth-- == 0)
        luaL_error(ms->L, "pattern too complex");
    init: /* using goto's to optimize tail recursion */
    if (p != ms->p_end) {  /* end of pattern? */
        switch (*p) {
            case '(': {  /* start capture */
                if (*(p + 1) == ')')  /* position capture? */
                    s = start_capture(ms, s, p + 2, CAP_POSITION);
                else
                    s = start_capture(ms, s, p + 1, CAP_UNFINISHED);
                break;
            }
            case ')': {  /* end capture */
                s = end_capture(ms, s, p + 1);
                break;
            }
            case '$': {
                if ((p + 1) != ms->p_end)  /* is the '$' the last char in pattern? */
                    goto dflt;  /* no; go to default */
                s = (s == ms->src_end) ? s : NULL;  /* check end of string */
                break;
            }
            case L_ESC: {  /* escaped sequences not in the format class[*+?-]? */
                switch (*(p + 1)) {
                    case 'b': {  /* balanced string? */
                        s = matchbalance(ms, s, p + 2);
                        if (s != NULL) {
                            p += 4;
                            goto init;  /* return match(ms, s, p + 4); */
                        }  /* else fail (s == NULL) */
                        break;
                    }
                    case 'f': {  /* frontier? */
                        const char *ep;
                        char previous;
                        p += 2;
                        if (*p != '[')
                            luaL_error(ms->L, "missing '[' after '%%f' in pattern");
                        ep = classend(ms, p);  /* points to what is next */
                        previous = (s == ms->src_init) ? '\0' : *(s - 1);
                        if (!matchbracketclass(uchar(previous), p, ep - 1) &&
                            matchbracketclass(uchar(*s), p, ep - 1)) {
                            p = ep;
                            goto init;  /* return match(ms, s, ep); */
                        }
                        s = NULL;  /* match failed */
                        break;
                    }
                    case '0':
                    case '1':
                    case '2':
                    case '3':
                    case '4':
                    case '5':
                    case '6':
                    case '7':
                    case '8':
                    case '9': {  /* capture results (%0-%9)? */
                        s = match_capture(ms, s, uchar(*(p + 1)));
                        if (s != NULL) {
                            p += 2;
                            goto init;  /* return match(ms, s, p + 2) */
                        }
                        break;
                    }
                    default:
                        goto dflt;
                }
                break;
            }
            default:
            dflt:
            {  /* pattern class plus optional suffix */
                const char *ep = classend(ms, p);  /* points to optional suffix */
                /* does not match at least once? */
                if (!singlematch(ms, s, p, ep)) {
                    if (*ep == '*' || *ep == '?' || *ep == '-') {  /* accept empty? */
                        p = ep + 1;
                        goto init;  /* return match(ms, s, ep + 1); */
                    } else  /* '+' or no suffix */
                        s = NULL;  /* fail */
                } else {  /* matched once */
                    switch (*ep) {  /* handle optional suffix */
                        case '?': {  /* optional */
                            const char *res;
                            if ((res = match(ms, s + 1, ep + 1)) != NULL)
                                s = res;
                            else {
                                p = ep + 1;
                                goto init;  /* else return match(ms, s, ep + 1); */
                            }
                            break;
                        }
                        case '+':  /* 1 or more repetitions */
                            s++;  /* 1 match already done */
                            /* FALLTHROUGH */
                        case '*':  /* 0 or more repetitions */
                            s = max_expand(ms, s, p, ep);
                            break;
                        case '-':  /* 0 or more repetitions (minimum) */
                            s = min_expand(ms, s, p, ep);
                            break;
                        default:  /* no suffix */
                            s++;
                            p = ep;
                            goto init;  /* return match(ms, s + 1, ep); */
                    }
                }
                break;
            }
        }
    }
    ms->matchdepth++;
    return s;
}